

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::scrape_tracker(torrent *this,int idx,bool user_triggered)

{
  tracker_list *this_00;
  node_ptr plVar1;
  announce_entry *ae;
  
  plVar1 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.next_;
  if (plVar1 != &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node
      && plVar1 != (node_ptr)0x0) {
    this_00 = &this->m_trackers;
    if ((idx < 0) ||
       ((int)(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.super_size_traits.size_
        <= idx)) {
      ae = tracker_list::last_working(this_00);
      if (ae == (announce_entry *)0x0) {
        ae = tracker_list::first(this_00);
      }
    }
    else {
      ae = tracker_list::find(this_00,idx);
    }
    if (ae != (announce_entry *)0x0) {
      scrape_tracker_impl(this,ae,user_triggered);
      return;
    }
  }
  return;
}

Assistant:

void torrent::scrape_tracker(int idx, bool const user_triggered)
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_trackers.empty()) return;

		aux::announce_entry* ae = nullptr;
		if (idx < 0 || idx >= int(m_trackers.size()))
		{
			ae = m_trackers.last_working();
			if (ae == nullptr) ae = m_trackers.first();
		}
		else
		{
			ae = m_trackers.find(idx);
		}
		if (ae == nullptr) return;

		scrape_tracker_impl(*ae, user_triggered);
	}